

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O1

void __thiscall BronKerbosch::printEdges(BronKerbosch *this,string *filename)

{
  bool bVar1;
  ostream *poVar2;
  pointer __x;
  BronKerbosch *this_00;
  ulong uVar3;
  ulong uVar4;
  alignment_set_t node;
  ofstream edgefile;
  string local_290;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  size_type local_258;
  undefined1 local_250 [32];
  clique_list_t *local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  if ((this->super_CliqueFinder).alignment_count != 0) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      __x = (this->vertices_->
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + uVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_270,&__x->m_bits);
      local_258 = __x->m_num_bits;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
      AlignmentRecord::getName_abi_cxx11_
                (&local_290,
                 (this->alignments_).
                 super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ->",3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      this_00 = (BronKerbosch *)local_250;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_250,&local_270);
      local_250._24_8_ = local_258;
      printSet(this_00,(ostream *)&local_230,(alignment_set_t *)local_250);
      if ((_func_int **)local_250._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_250._0_8_);
      }
      if (local_270.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      bVar1 = uVar4 < (this->super_CliqueFinder).alignment_count;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  local_230 = _VTT;
  *(undefined8 *)
   (local_228 +
   (long)&_VTT[-1].super__List_base<Clique_*,_std::allocator<Clique_*>_>._M_impl._M_node.
          super__List_node_base._M_next[-1]._M_prev) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void BronKerbosch::printEdges(std::string filename) {
    ofstream edgefile(filename, ofstream::out);

    for(unsigned int i = 0; i < alignment_count; i++) {
        alignment_set_t node = (*vertices_)[i];
        edgefile << i << ":" << alignments_[i]->getName() << " ->";
        
        printSet(edgefile, node);
    }
}